

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

unique_ptr<perfetto::ProducerEndpoint,_std::default_delete<perfetto::ProducerEndpoint>_> __thiscall
perfetto::internal::SystemTracingBackend::ConnectProducer
          (SystemTracingBackend *this,ConnectProducerArgs *args)

{
  uint __errnum;
  code *pcVar1;
  char *pcVar2;
  uint *puVar3;
  char *pcVar4;
  string *in_RDX;
  pointer *__ptr;
  _Head_base<0UL,_perfetto::SharedMemoryArbiter_*,_false> local_38;
  _Head_base<0UL,_perfetto::SharedMemory_*,_false> local_30;
  
  pcVar2 = GetProducerSocket();
  local_30._M_head_impl = (SharedMemory *)0x0;
  local_38._M_head_impl = (SharedMemoryArbiter *)0x0;
  ProducerIPCClient::Connect
            ((ProducerIPCClient *)this,pcVar2,(Producer *)in_RDX[1]._M_dataplus._M_p,in_RDX,
             (TaskRunner *)in_RDX[1]._M_string_length,kEnabled,(ulong)*(uint *)&in_RDX[1].field_2,
             (ulong)*(uint *)((long)&in_RDX[1].field_2 + 4),
             (unique_ptr<perfetto::SharedMemory,_std::default_delete<perfetto::SharedMemory>_> *)
             &local_30,
             (unique_ptr<perfetto::SharedMemoryArbiter,_std::default_delete<perfetto::SharedMemoryArbiter>_>
              *)&local_38,kRetryIfUnreachable);
  if (local_38._M_head_impl != (SharedMemoryArbiter *)0x0) {
    (*(local_38._M_head_impl)->_vptr_SharedMemoryArbiter[1])();
  }
  if (local_30._M_head_impl != (SharedMemory *)0x0) {
    (*(local_30._M_head_impl)->_vptr_SharedMemory[1])();
  }
  if ((this->super_TracingBackend)._vptr_TracingBackend != (_func_int **)0x0) {
    return (__uniq_ptr_data<perfetto::ProducerEndpoint,_std::default_delete<perfetto::ProducerEndpoint>,_true,_true>
            )(__uniq_ptr_data<perfetto::ProducerEndpoint,_std::default_delete<perfetto::ProducerEndpoint>,_true,_true>
              )this;
  }
  pcVar2 = base::Basename(
                         "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                         );
  puVar3 = (uint *)__errno_location();
  __errnum = *puVar3;
  pcVar4 = strerror(__errnum);
  base::LogMessage(kLogError,pcVar2,0x1244f,"%s (errno: %d, %s)","PERFETTO_CHECK(endpoint)",
                   (ulong)__errnum,pcVar4);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

std::unique_ptr<ProducerEndpoint> SystemTracingBackend::ConnectProducer(
    const ConnectProducerArgs& args) {
  PERFETTO_DCHECK(args.task_runner->RunsTasksOnCurrentThread());

  auto endpoint = ProducerIPCClient::Connect(
      GetProducerSocket(), args.producer, args.producer_name, args.task_runner,
      TracingService::ProducerSMBScrapingMode::kEnabled,
      args.shmem_size_hint_bytes, args.shmem_page_size_hint_bytes, nullptr,
      nullptr, ProducerIPCClient::ConnectionFlags::kRetryIfUnreachable);
  PERFETTO_CHECK(endpoint);
  return endpoint;
}